

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int emit_goto(JSParseState *s,int opcode,int label)

{
  LabelSlot *pLVar1;
  JSFunctionDef *fd;
  BOOL BVar2;
  uint8_t local_24 [4];
  
  fd = s->cur_func;
  BVar2 = js_is_live_code((JSParseState *)fd);
  if (BVar2 == 0) {
    label = -1;
  }
  else {
    if (label < 0) {
      label = new_label_fd(fd,-1);
    }
    emit_op(s,(uint8_t)opcode);
    dbuf_put(&s->cur_func->byte_code,local_24,4);
    pLVar1 = s->cur_func->label_slots + label;
    pLVar1->ref_count = pLVar1->ref_count + 1;
  }
  return label;
}

Assistant:

static int emit_goto(JSParseState *s, int opcode, int label)
{
    if (js_is_live_code(s)) {
        if (label < 0)
            label = new_label(s);
        emit_op(s, opcode);
        emit_u32(s, label);
        s->cur_func->label_slots[label].ref_count++;
        return label;
    }
    return -1;
}